

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StockMatcher.cpp
# Opt level: O2

void __thiscall StockMatcher::executeMatching(StockMatcher *this)

{
  MatchingEngine *this_00;
  orderType oVar1;
  pointer pbVar2;
  ulong uVar3;
  long lVar4;
  string textLine;
  pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  messageStatus;
  tuple<std::pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_Order>
  message;
  Order order;
  
  this_00 = &this->m_stockMatchEngine;
  MatchingEngine::setOutPutStream(this_00);
  textLine._M_dataplus._M_p = (pointer)&textLine.field_2;
  textLine._M_string_length = 0;
  textLine.field_2._M_local_buf[0] = '\0';
  pbVar2 = (this->m_cachedStream).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar4 = -1;
  uVar3 = 1;
  while( true ) {
    if (pbVar2 == (this->m_cachedStream).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) break;
    std::__cxx11::string::_M_assign((string *)&textLine);
    if (textLine._M_string_length != 0) {
      OrderValidator::validateOrder(&message,(OrderValidator *)&this->field_0x20,&textLine);
      std::
      pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      pair(&messageStatus,
           &message.
            super__Tuple_impl<0UL,_std::pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_Order>
            .
            super__Head_base<0UL,_std::pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
            ._M_head_impl);
      if (messageStatus.first == true) {
        Order::Order(&order,(Order *)&message);
        oVar1 = Order::getOrderType(&order);
        if (oVar1 == buyOrder) {
          MatchingEngine::addIntoBuyQueue(this_00,(function<void_()> *)&order);
        }
        else {
          MatchingEngine::addIntoSellQueue(this_00,(function<void_()> *)&order);
        }
        MatchingEngine::runMatching(this_00);
      }
      else {
        MatchingEngine::pushInBadOrder(this_00,&textLine,&messageStatus.second);
      }
      std::__cxx11::string::~string((string *)&messageStatus.second);
      std::__cxx11::string::~string
                ((string *)
                 &message.
                  super__Tuple_impl<0UL,_std::pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_Order>
                  .
                  super__Head_base<0UL,_std::pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                  ._M_head_impl.second);
    }
    if ((uVar3 / 10) * 10 + lVar4 == 0) {
      MatchingEngine::displayOrderBook(this_00);
    }
    pbVar2 = pbVar2 + 1;
    lVar4 = lVar4 + -1;
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&message,"Bad order summary : ",(allocator<char> *)&messageStatus);
  MatchingEngine::writeToLog(this_00,(string *)&message);
  std::__cxx11::string::~string((string *)&message);
  MatchingEngine::displayBadOrders(this_00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&message,"Final queue summary : ",(allocator<char> *)&messageStatus);
  MatchingEngine::writeToLog(this_00,(string *)&message);
  std::__cxx11::string::~string((string *)&message);
  MatchingEngine::displayOrderBook(this_00);
  std::__cxx11::string::~string((string *)&textLine);
  return;
}

Assistant:

void StockMatcher::executeMatching()
{
	m_stockMatchEngine.setOutPutStream();
    std::string textLine;
    long lineCount = 0;
    auto cacheIter = m_cachedStream.begin();
    while(cacheIter != m_cachedStream.end())
    {
        textLine = *cacheIter;
        lineCount++;
        if(textLine.length()>0)
        {
            std::tuple<std::pair<bool,std::string>,Order> message = m_validator.validateOrder(textLine);
            std::pair<bool,std::string> messageStatus = std::get<0>(message);
            bool status = messageStatus.first;
            if(status)
            {
                Order order = std::get<1>(message);
                if(order.getOrderType() == orderType::buyOrder)
                {
                    m_stockMatchEngine.addIntoBuyQueue(order);
                }
                else
                {
                    m_stockMatchEngine.addIntoSellQueue(order);
                }
                // Now run the stockMatching engine.
                m_stockMatchEngine.runMatching();
            }
            else
            {
                m_stockMatchEngine.pushInBadOrder(textLine, messageStatus.second);
            }
        }

        // There is a need every 10th Message to print the buy and sell queues. do that here.
        if(lineCount%10 == 0)
            m_stockMatchEngine.displayOrderBook();

        cacheIter++;
    }

    // Display a final summary of any bad orders at the end of execution.
    m_stockMatchEngine.writeToLog("Bad order summary : ");
    m_stockMatchEngine.displayBadOrders();
    m_stockMatchEngine.writeToLog("Final queue summary : ");
    m_stockMatchEngine.displayOrderBook();
}